

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.h
# Opt level: O0

void __thiscall
Imf_2_5::TypedDeepImageChannel<half>::initializeSampleLists(TypedDeepImageChannel<half> *this)

{
  undefined1 auVar1 [16];
  SampleCountChannel *pSVar2;
  uint *puVar3;
  size_t *psVar4;
  size_t sVar5;
  ulong uVar6;
  void *pvVar7;
  ImageChannel *in_RDI;
  uint j;
  size_t i;
  size_t *sampleListPositions;
  uint *numSamples;
  half *this_00;
  undefined2 local_26;
  uint local_24;
  ulong local_20;
  
  this_00 = *(half **)&in_RDI[1]._xSampling;
  if (this_00 != (half *)0x0) {
    operator_delete__(this_00);
  }
  in_RDI[1]._xSampling = 0;
  in_RDI[1]._ySampling = 0;
  pSVar2 = DeepImageChannel::sampleCounts((DeepImageChannel *)0x12b43e);
  puVar3 = SampleCountChannel::numSamples(pSVar2);
  pSVar2 = DeepImageChannel::sampleCounts((DeepImageChannel *)0x12b455);
  psVar4 = SampleCountChannel::sampleListPositions(pSVar2);
  pSVar2 = DeepImageChannel::sampleCounts((DeepImageChannel *)0x12b46c);
  sVar5 = SampleCountChannel::sampleBufferSize(pSVar2);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar5;
  uVar6 = SUB168(auVar1 * ZEXT816(2),0);
  if (SUB168(auVar1 * ZEXT816(2),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pvVar7 = operator_new__(uVar6);
  *(void **)&in_RDI[1]._xSampling = pvVar7;
  (*in_RDI->_vptr_ImageChannel[9])();
  local_20 = 0;
  while( true ) {
    sVar5 = ImageChannel::numPixels(in_RDI);
    if (sVar5 <= local_20) break;
    in_RDI[1]._vptr_ImageChannel[local_20] =
         (_func_int *)(*(long *)&in_RDI[1]._xSampling + psVar4[local_20] * 2);
    for (local_24 = 0; local_24 < puVar3[local_20]; local_24 = local_24 + 1) {
      half::half(this_00,(float)((ulong)in_RDI >> 0x20));
      *(undefined2 *)(in_RDI[1]._vptr_ImageChannel[local_20] + (ulong)local_24 * 2) = local_26;
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void
TypedDeepImageChannel<T>::initializeSampleLists ()
{
    //
    // Allocate a new set of sample lists for this channel, and
    // construct zero-filled sample lists for the pixels.
    //

    delete [] _sampleBuffer;

    _sampleBuffer = 0;          // set to 0 to prevent double deletion
                                // in case of an exception

    const unsigned int * numSamples = sampleCounts().numSamples();
    const size_t * sampleListPositions = sampleCounts().sampleListPositions();

    _sampleBuffer = new T [sampleCounts().sampleBufferSize()];
    
    resetBasePointer();

    for (size_t i = 0; i < numPixels(); ++i)
    {
        _sampleListPointers[i] = _sampleBuffer + sampleListPositions[i];

        for (unsigned int j = 0; j < numSamples[i]; ++j)
            _sampleListPointers[i][j] = T (0);
    }
}